

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Solid.cpp
# Opt level: O1

ssize_t __thiscall MeshLib::Solid::read(Solid *this,int __fd,void *__buf,size_t __nbytes)

{
  Solid *this_00;
  int iVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  long *plVar5;
  size_t sVar6;
  tVertex pVVar7;
  tFace pFVar8;
  double *pdVar9;
  tEdge pEVar10;
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  long lVar11;
  string *this_01;
  int i_1;
  HalfEdge *pHVar12;
  int i;
  string_token_iterator iter;
  string s;
  string str;
  Point p;
  char line [2048];
  string_token_iterator local_8e8;
  Solid *local_8c8;
  undefined1 *local_8c0 [2];
  undefined1 local_8b0 [16];
  double local_8a0;
  string local_898;
  char *local_878 [2];
  char local_868 [16];
  Point local_858;
  long *local_840;
  char local_838 [2056];
  
  plVar5 = (long *)CONCAT44(in_register_00000034,__fd);
  if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 7) == 0) {
    lVar11 = *(long *)(*plVar5 + -0x18) + (long)plVar5;
    local_8c8 = this;
    local_840 = plVar5;
    do {
      plVar5 = local_840;
      std::ios::widen((char)lVar11);
      plVar5 = (long *)std::istream::getline((char *)plVar5,(long)local_838,'\0');
      if ((*(byte *)((long)plVar5 + *(long *)(*plVar5 + -0x18) + 0x20) & 5) != 0) break;
      if (local_838[0] != '\0') {
        local_898._M_dataplus._M_p = (pointer)&local_898.field_2;
        sVar6 = strlen(local_838);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_898,local_838,local_838 + sVar6);
        local_8e8.separator = " \n";
        local_8e8.end = 0;
        local_8e8.str = &local_898;
        string_token_iterator::find_next(&local_8e8);
        std::__cxx11::string::string
                  ((string *)local_878,(string *)local_8e8.str,local_8e8.start,
                   local_8e8.end - local_8e8.start);
        iVar1 = std::__cxx11::string::compare((char *)local_878);
        if (iVar1 == 0) {
          string_token_iterator::find_next(&local_8e8);
          std::__cxx11::string::string
                    ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                     local_8e8.end - local_8e8.start);
          std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
          if (local_8c0[0] != local_8b0) {
            operator_delete(local_8c0[0]);
          }
          iVar1 = atoi(local_878[0]);
          local_858.v[0] = 0.0;
          local_858.v[1] = 0.0;
          local_858.v[2] = 0.0;
          iVar2 = 0;
          do {
            string_token_iterator::find_next(&local_8e8);
            std::__cxx11::string::string
                      ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                       local_8e8.end - local_8e8.start);
            std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
            if (local_8c0[0] != local_8b0) {
              operator_delete(local_8c0[0]);
            }
            local_8a0 = atof(local_878[0]);
            pdVar9 = Point::operator[](&local_858,iVar2);
            *pdVar9 = local_8a0;
            iVar2 = iVar2 + 1;
          } while (iVar2 != 3);
          pVVar7 = createVertex(local_8c8,iVar1);
          (pVVar7->m_point).v[2] = local_858.v[2];
          (pVVar7->m_point).v[0] = local_858.v[0];
          (pVVar7->m_point).v[1] = local_858.v[1];
          pVVar7->m_id = iVar1;
          uVar3 = std::__cxx11::string::find((char *)&local_898,0x1156a0,0);
          uVar4 = std::__cxx11::string::find((char *)&local_898,0x1156f6,0);
          if (-1 < (int)(uVar4 | uVar3)) {
            std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
            this_01 = (string *)&pVVar7->m_string;
LAB_0010fd6b:
            std::__cxx11::string::operator=(this_01,(string *)local_8c0);
            if (local_8c0[0] != local_8b0) {
              operator_delete(local_8c0[0]);
            }
          }
        }
        else {
          iVar1 = std::__cxx11::string::compare((char *)local_878);
          if (iVar1 == 0) {
            string_token_iterator::find_next(&local_8e8);
            std::__cxx11::string::string
                      ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                       local_8e8.end - local_8e8.start);
            std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
            if (local_8c0[0] != local_8b0) {
              operator_delete(local_8c0[0]);
            }
            iVar1 = atoi(local_878[0]);
            lVar11 = 0;
            do {
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              iVar2 = atoi(local_878[0]);
              *(int *)((long)local_858.v + lVar11 * 4) = iVar2;
              lVar11 = lVar11 + 1;
            } while (lVar11 != 3);
            pFVar8 = createFace(local_8c8,(int *)&local_858,iVar1);
            uVar3 = std::__cxx11::string::find((char *)&local_898,0x1156a0,0);
            uVar4 = std::__cxx11::string::find((char *)&local_898,0x1156f6,0);
            if (-1 < (int)(uVar4 | uVar3)) {
              std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
              this_01 = (string *)&pFVar8->m_string;
              goto LAB_0010fd6b;
            }
          }
          else {
            iVar1 = std::__cxx11::string::compare((char *)local_878);
            if (iVar1 == 0) {
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              iVar1 = atoi(local_878[0]);
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              iVar2 = atoi(local_878[0]);
              pEVar10 = idEdge(this,iVar1,iVar2);
              string_token_iterator::find_next(&local_8e8);
              std::__cxx11::string::string
                        ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                         local_8e8.end - local_8e8.start);
              std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
              if (local_8c0[0] != local_8b0) {
                operator_delete(local_8c0[0]);
              }
              uVar3 = std::__cxx11::string::find((char *)&local_898,0x1156a0,0);
              uVar4 = std::__cxx11::string::find((char *)&local_898,0x1156f6,0);
              if (-1 < (int)(uVar4 | uVar3)) {
                std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
                this_01 = (string *)&pEVar10->m_string;
                goto LAB_0010fd6b;
              }
            }
            else {
              iVar1 = std::__cxx11::string::compare((char *)local_878);
              if (iVar1 == 0) {
                string_token_iterator::find_next(&local_8e8);
                std::__cxx11::string::string
                          ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                           local_8e8.end - local_8e8.start);
                std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
                if (local_8c0[0] != local_8b0) {
                  operator_delete(local_8c0[0]);
                }
                iVar1 = atoi(local_878[0]);
                string_token_iterator::find_next(&local_8e8);
                std::__cxx11::string::string
                          ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                           local_8e8.end - local_8e8.start);
                std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
                if (local_8c0[0] != local_8b0) {
                  operator_delete(local_8c0[0]);
                }
                iVar2 = atoi(local_878[0]);
                this_00 = local_8c8;
                local_8a0 = (double)CONCAT44(local_8a0._4_4_,iVar2);
                pVVar7 = idVertex(local_8c8,iVar1);
                pFVar8 = idFace(this_00,local_8a0._0_4_);
                pHVar12 = pFVar8->m_halfedge;
                do {
                  if (pHVar12->m_vertex == pVVar7) goto LAB_0010f8fa;
                  pHVar12 = pHVar12->m_next;
                } while (pHVar12 != pFVar8->m_halfedge);
                pHVar12 = (HalfEdge *)0x0;
LAB_0010f8fa:
                string_token_iterator::find_next(&local_8e8);
                std::__cxx11::string::string
                          ((string *)local_8c0,(string *)local_8e8.str,local_8e8.start,
                           local_8e8.end - local_8e8.start);
                std::__cxx11::string::operator=((string *)local_878,(string *)local_8c0);
                if (local_8c0[0] != local_8b0) {
                  operator_delete(local_8c0[0]);
                }
                uVar3 = std::__cxx11::string::find((char *)&local_898,0x1156a0,0);
                uVar4 = std::__cxx11::string::find((char *)&local_898,0x1156f6,0);
                if (-1 < (int)(uVar4 | uVar3)) {
                  std::__cxx11::string::substr((ulong)local_8c0,(ulong)&local_898);
                  this_01 = (string *)&pHVar12->m_string;
                  goto LAB_0010fd6b;
                }
              }
            }
          }
        }
        if (local_878[0] != local_868) {
          operator_delete(local_878[0]);
        }
        this = local_8c8;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_898._M_dataplus._M_p != &local_898.field_2) {
          operator_delete(local_898._M_dataplus._M_p);
        }
      }
      lVar11 = (long)local_840 + *(long *)(*local_840 + -0x18);
    } while ((*(byte *)((long)local_840 + *(long *)(*local_840 + -0x18) + 0x20) & 7) == 0);
  }
  labelBoundaryEdges(this);
  removeDanglingVertices(this);
  return extraout_RAX;
}

Assistant:

void Solid::read( std::istream & is ) {
	char line[MAX_LINE];
	int id;

	while( is && !is.eof() && is.getline(line, MAX_LINE) )
	{		
		if( strlen( line ) == 0 ) continue;

		std::string s(line);

		string_token_iterator iter(s, " \n"); 
		
		std::string str = *iter;

		if( str == "Vertex" ) 
		{
			
			str = *(++iter);

			id = atoi( str.c_str() );


			Point p;
			for( int i = 0 ; i < 3; i ++ )
			{
				str = *(++iter);
				p[i] = atof( str.c_str() );
			}
		
			tVertex v  = createVertex( id );
			
			v->point() = p;
			v->id()    = id;

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				v->string() = s.substr( sp+1, ep-sp-1 );
			}

			continue;

		}

		if( str == "Face" ) {
			str = *(++iter);

			id = atoi( str.c_str() );
	
			int v[3];
			for( int i = 0; i < 3; i ++ ) {
				str = *(++iter);
				v[i] = atoi( str.c_str() );
			}

			tFace f = createFace( v, id );
			

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				f->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}

		//read in edge attributes
		if( str == "Edge" )
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );

			str = *(++iter);
			int id1 = atoi( str.c_str() );

			tEdge edge = idEdge( id0, id1 );
			
			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				edge->string() = s.substr( sp+1, ep-sp-1 );
			}
			
			continue;

		}

		//read in edge attributes
		if( str == "Corner" ) 
		{
			str = *(++iter);
			int id0 = atoi( str.c_str() );
				
			str = *(++iter);
			int id1 = atoi( str.c_str() );


			Vertex * v = idVertex( id0 );
			Face   * f = idFace( id1 );
			tHalfEdge he = corner( v, f );

			str = *(++iter);

			int sp = (int)s.find("{");
			int ep = (int)s.find("}");

			if( sp >= 0 && ep >= 0 )
			{
				he->string() = s.substr( sp+1, ep-sp-1 );
			}
			continue;
		}


	}

	labelBoundaryEdges();

	removeDanglingVertices();

}